

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O0

float ht_cpu_usage_get_percentage(HT_CPUUsageContext *context)

{
  HT_Boolean HVar1;
  float local_40;
  float local_38;
  float elapsed;
  unsigned_long tics;
  unsigned_long total_time;
  HT_TimestampNs current_ts;
  HT_CPUUsageContext *context_local;
  
  current_ts = (HT_TimestampNs)context;
  total_time = ht_monotonic_clock_get_timestamp();
  HVar1 = _get_process_time(&tics,*(int *)(current_ts + 0x10));
  if (HVar1 == 0) {
    context_local._4_4_ = -1.0;
  }
  else {
    local_38 = (float)(total_time - *(long *)current_ts);
    local_40 = (float)(tics - *(long *)(current_ts + 8));
    *(float *)(current_ts + 0x14) =
         (local_40 * 100.0) / ((float)_clock_ticks_per_sec * (local_38 / 1e+09));
    *(unsigned_long *)(current_ts + 8) = tics;
    *(unsigned_long *)current_ts = total_time;
    context_local._4_4_ = *(float *)(current_ts + 0x14);
  }
  return context_local._4_4_;
}

Assistant:

float
ht_cpu_usage_get_percentage(HT_CPUUsageContext* context)
{
    HT_TimestampNs current_ts = ht_monotonic_clock_get_timestamp();
    unsigned long total_time;
    unsigned long tics;
    float elapsed;

    if (_get_process_time(&total_time, context->pid) == HT_FALSE)
    {
        return -1.0f;
    }

    tics = total_time - context->last_total_time;
    elapsed = (current_ts - context->last_probe) / 1000000000.0f;

    context->value = tics * 100.0f / (_clock_ticks_per_sec * elapsed);
    context->last_total_time = total_time;
    context->last_probe = current_ts;

    return context->value;
}